

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O0

REF_STATUS ref_cloud_create(REF_CLOUD *ref_cloud_ptr,REF_INT naux)

{
  REF_CLOUD pRVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  REF_CLOUD ref_cloud;
  REF_INT naux_local;
  REF_CLOUD *ref_cloud_ptr_local;
  
  pRVar1 = (REF_CLOUD)malloc(0x20);
  *ref_cloud_ptr = pRVar1;
  if (*ref_cloud_ptr == (REF_CLOUD)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x1e,
           "ref_cloud_create","malloc *ref_cloud_ptr of REF_CLOUD_STRUCT NULL");
    ref_cloud_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_cloud_ptr;
    pRVar1->n = 0;
    pRVar1->max = 0x14;
    pRVar1->naux = naux;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x26,
             "ref_cloud_create","malloc ref_cloud->global of REF_GLOB negative");
      ref_cloud_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_GLOB *)malloc((long)pRVar1->max << 3);
      pRVar1->global = pRVar2;
      if (pRVar1->global == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
               0x26,"ref_cloud_create","malloc ref_cloud->global of REF_GLOB NULL");
        ref_cloud_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->naux * pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
               0x28,"ref_cloud_create","malloc ref_cloud->aux of REF_DBL negative");
        ref_cloud_ptr_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_DBL *)malloc((long)(pRVar1->naux * pRVar1->max) << 3);
        pRVar1->aux = pRVar3;
        if (pRVar1->aux == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",
                 0x28,"ref_cloud_create","malloc ref_cloud->aux of REF_DBL NULL");
          ref_cloud_ptr_local._4_4_ = 2;
        }
        else {
          ref_cloud_ptr_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_cloud_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_create(REF_CLOUD *ref_cloud_ptr, REF_INT naux) {
  REF_CLOUD ref_cloud;

  ref_malloc(*ref_cloud_ptr, 1, REF_CLOUD_STRUCT);

  ref_cloud = (*ref_cloud_ptr);

  ref_cloud_n(ref_cloud) = 0;
  ref_cloud_max(ref_cloud) = 20;
  ref_cloud_naux(ref_cloud) = naux;

  ref_malloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
  ref_malloc(ref_cloud->aux,
             ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);

  return REF_SUCCESS;
}